

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O0

ZeroCopyOutputStream * __thiscall
google::protobuf::compiler::GeneratorResponseContext::OpenForInsert
          (GeneratorResponseContext *this,string *filename,string *insertion_point)

{
  CodeGeneratorResponse_File *this_00;
  uint32_t *puVar1;
  Arena *pAVar2;
  StringOutputStream *this_01;
  string *target;
  File *file;
  string *insertion_point_local;
  string *filename_local;
  GeneratorResponseContext *this_local;
  
  this_00 = CodeGeneratorResponse::add_file(this->response_);
  puVar1 = internal::HasBits<1>::operator[](&(this_00->field_0)._impl_._has_bits_,0);
  *(byte *)puVar1 = (byte)*puVar1 | 1;
  pAVar2 = MessageLite::GetArena((MessageLite *)this_00);
  internal::ArenaStringPtr::Set<>(&(this_00->field_0)._impl_.name_,filename,pAVar2);
  puVar1 = internal::HasBits<1>::operator[](&(this_00->field_0)._impl_._has_bits_,0);
  *(byte *)puVar1 = (byte)*puVar1 | 2;
  pAVar2 = MessageLite::GetArena((MessageLite *)this_00);
  internal::ArenaStringPtr::Set<>
            (&(this_00->field_0)._impl_.insertion_point_,insertion_point,pAVar2);
  this_01 = (StringOutputStream *)operator_new(0x10);
  target = CodeGeneratorResponse_File::mutable_content_abi_cxx11_(this_00);
  io::StringOutputStream::StringOutputStream(this_01,target);
  return &this_01->super_ZeroCopyOutputStream;
}

Assistant:

io::ZeroCopyOutputStream* OpenForInsert(
      const std::string& filename,
      const std::string& insertion_point) override {
    CodeGeneratorResponse::File* file = response_->add_file();
    file->set_name(filename);
    file->set_insertion_point(insertion_point);
    return new io::StringOutputStream(file->mutable_content());
  }